

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip6.c
# Opt level: O0

Curl_addrinfo * Curl_getaddrinfo(Curl_easy *data,char *hostname,int port,int *waitp)

{
  _Bool _Var1;
  int iVar2;
  undefined4 local_10c;
  undefined1 local_108 [4];
  int pf;
  char addrbuf [128];
  char **local_80;
  char *sbufptr;
  char sbuf [12];
  int error;
  Curl_addrinfo *res;
  addrinfo hints;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  local_80 = (char **)0x0;
  local_10c = 2;
  *waitp = 0;
  hints.ai_next = (addrinfo *)waitp;
  if ((data->conn->ip_version != '\x01') && (_Var1 = Curl_ipv6works(data), _Var1)) {
    local_10c = 0;
  }
  memset(&res,0,0x30);
  res._4_4_ = local_10c;
  hints.ai_flags = 2;
  if (data->conn->transport == '\x03') {
    hints.ai_flags = 1;
  }
  iVar2 = inet_pton(2,hostname,local_108);
  if ((iVar2 == 1) || (iVar2 = inet_pton(10,hostname,local_108), iVar2 == 1)) {
    res._0_4_ = 4;
  }
  if (port != 0) {
    curl_msnprintf((char *)&sbufptr,0xc,"%d",(ulong)(uint)port);
    local_80 = &sbufptr;
  }
  sbuf._4_4_ = Curl_getaddrinfo_ex(hostname,(char *)local_80,(addrinfo *)&res,
                                   (Curl_addrinfo **)(sbuf + 8));
  if (sbuf._4_4_ == 0) {
    data_local = stack0xffffffffffffff98;
  }
  else {
    Curl_infof(data,"getaddrinfo(3) failed for %s:%d",hostname,(ulong)(uint)port);
    data_local = (Curl_easy *)0x0;
  }
  return (Curl_addrinfo *)data_local;
}

Assistant:

struct Curl_addrinfo *Curl_getaddrinfo(struct Curl_easy *data,
                                       const char *hostname,
                                       int port,
                                       int *waitp)
{
  struct addrinfo hints;
  struct Curl_addrinfo *res;
  int error;
  char sbuf[12];
  char *sbufptr = NULL;
#ifndef USE_RESOLVE_ON_IPS
  char addrbuf[128];
#endif
  int pf = PF_INET;

  *waitp = 0; /* synchronous response only */

  if((data->conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data))
    /* The stack seems to be IPv6-enabled */
    pf = PF_UNSPEC;

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (data->conn->transport == TRNSPRT_TCP) ?
    SOCK_STREAM : SOCK_DGRAM;

#ifndef USE_RESOLVE_ON_IPS
  /*
   * The AI_NUMERICHOST must not be set to get synthesized IPv6 address from
   * an IPv4 address on iOS and Mac OS X.
   */
  if((1 == Curl_inet_pton(AF_INET, hostname, addrbuf)) ||
     (1 == Curl_inet_pton(AF_INET6, hostname, addrbuf))) {
    /* the given address is numerical only, prevent a reverse lookup */
    hints.ai_flags = AI_NUMERICHOST;
  }
#endif

  if(port) {
    msnprintf(sbuf, sizeof(sbuf), "%d", port);
    sbufptr = sbuf;
  }

  error = Curl_getaddrinfo_ex(hostname, sbufptr, &hints, &res);
  if(error) {
    infof(data, "getaddrinfo(3) failed for %s:%d", hostname, port);
    return NULL;
  }

  if(port) {
    Curl_addrinfo_set_port(res, port);
  }

  dump_addrinfo(conn, res);

  return res;
}